

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::Chapters::WriteEdition(Chapters *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  uint64 uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t stop;
  uint64_t chapter_size;
  Chapter *chapter_1;
  int idx_1;
  int64_t start;
  uint64_t edition_size;
  Chapter *chapter;
  uint64 uStack_28;
  int idx;
  uint64_t payload_size;
  IMkvWriter *writer_local;
  Chapters *this_local;
  
  uStack_28 = 0;
  for (chapter._4_4_ = 0; chapter._4_4_ < this->chapters_count_; chapter._4_4_ = chapter._4_4_ + 1)
  {
    uVar4 = Chapter::WriteAtom(this->chapters_ + chapter._4_4_,(IMkvWriter *)0x0);
    uStack_28 = uVar4 + uStack_28;
  }
  uVar5 = EbmlMasterElementSize(0x45b9,uStack_28);
  this_local = (Chapters *)(uVar5 + uStack_28);
  if (writer != (IMkvWriter *)0x0) {
    iVar2 = (*writer->_vptr_IMkvWriter[1])();
    bVar1 = WriteEbmlMasterElement(writer,0x45b9,uStack_28);
    if (bVar1) {
      for (chapter_1._4_4_ = 0; chapter_1._4_4_ < this->chapters_count_;
          chapter_1._4_4_ = chapter_1._4_4_ + 1) {
        uVar4 = Chapter::WriteAtom(this->chapters_ + chapter_1._4_4_,writer);
        if (uVar4 == 0) {
          return 0;
        }
      }
      iVar3 = (*writer->_vptr_IMkvWriter[1])();
      if ((CONCAT44(extraout_var,iVar2) <= CONCAT44(extraout_var_00,iVar3)) &&
         ((Chapters *)(CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2)) != this_local
         )) {
        this_local = (Chapters *)0x0;
      }
    }
    else {
      this_local = (Chapters *)0x0;
    }
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t Chapters::WriteEdition(IMkvWriter* writer) const {
  uint64_t payload_size = 0;

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& chapter = chapters_[idx];
    payload_size += chapter.WriteAtom(NULL);
  }

  const uint64_t edition_size =
      EbmlMasterElementSize(libwebm::kMkvEditionEntry, payload_size) +
      payload_size;

  if (writer == NULL)  // return size only
    return edition_size;

  const int64_t start = writer->Position();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvEditionEntry, payload_size))
    return 0;  // error

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& chapter = chapters_[idx];

    const uint64_t chapter_size = chapter.WriteAtom(writer);
    if (chapter_size == 0)  // error
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != edition_size)
    return 0;

  return edition_size;
}